

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O3

void blend_tiled_argb(int count,QT_FT_Span *spans,void *userData)

{
  QT_FT_Span *pQVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  char cVar5;
  QThreadPool *pQVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  long in_FS_OFFSET;
  QSemaphore semaphore;
  Operator op;
  undefined1 *local_120;
  QT_FT_Span *local_118;
  int local_110;
  uint local_10c;
  int local_108;
  uint local_104;
  int local_100;
  undefined4 uStack_fc;
  void *local_f8;
  CompositionFunction local_f0;
  Operator local_e8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(uint *)((long)userData + 0xd0) | 2) != 6) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      blend_tiled_generic(count,spans,userData);
      return;
    }
    goto LAB_00656b0e;
  }
  memcpy(&local_e8,&DAT_006ce8d0,0xb0);
  getOperator(&local_e8,(QSpanData *)userData,spans,count);
  uVar3 = *(uint *)((long)userData + 0xb0);
  uVar4 = *(uint *)((long)userData + 0xb4);
  iVar14 = (int)((double)((ulong)-*(double *)((long)userData + 0x70) & 0x8000000000000000 |
                         0x3fe0000000000000) - *(double *)((long)userData + 0x70)) % (int)uVar3;
  iVar10 = (int)((double)((ulong)-*(double *)((long)userData + 0x78) & 0x8000000000000000 |
                         0x3fe0000000000000) - *(double *)((long)userData + 0x78)) % (int)uVar4;
  uVar15 = 0;
  if (0 < iVar14) {
    uVar15 = uVar3;
  }
  iVar14 = uVar15 - iVar14;
  uVar15 = 0;
  if (0 < iVar10) {
    uVar15 = uVar4;
  }
  iVar10 = uVar15 - iVar10;
  iVar16 = *(int *)((long)userData + 0xe8);
  _local_100 = CONCAT44(0xaaaaaaaa,iVar16);
  local_f0 = local_e8.func;
  iVar17 = count + 0x5f;
  if (-1 < count + 0x20) {
    iVar17 = count + 0x20;
  }
  local_118 = spans;
  local_110 = iVar14;
  local_10c = uVar3;
  local_108 = iVar10;
  local_104 = uVar4;
  local_f8 = userData;
  pQVar6 = QGuiApplicationPrivate::qtGuiThreadPool();
  if (count < 0x60) {
    if (0 < count) goto LAB_006569c4;
  }
  else {
    if ((pQVar6 != (QThreadPool *)0x0) && (2 < (int)qPixelLayouts[*(uint *)(*userData + 0x10)].bpp))
    {
      QThread::currentThread();
      cVar5 = QThreadPool::contains((QThread *)pQVar6);
      if (cVar5 == '\0') {
        iVar17 = iVar17 >> 6;
        local_120 = &DAT_aaaaaaaaaaaaaaaa;
        iVar14 = 0;
        QSemaphore::QSemaphore((QSemaphore *)&local_120,0);
        iVar10 = 1;
        if (1 < iVar17) {
          iVar10 = iVar17;
        }
        iVar16 = 0;
        do {
          iVar13 = (count - iVar16) / (iVar17 + iVar14);
          puVar7 = (undefined8 *)operator_new(0x18);
          *(undefined1 *)(puVar7 + 1) = 1;
          *puVar7 = QFactoryLoader::keyMap;
          puVar8 = (undefined8 *)operator_new(0x20);
          *puVar8 = QRunnable::QGenericRunnable::
                    Helper<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/painting/qdrawhelper.cpp:4952:5)>
                    ::impl;
          *(int *)(puVar8 + 1) = iVar16;
          *(int *)((long)puVar8 + 0xc) = iVar13;
          puVar8[2] = &local_118;
          puVar8[3] = &local_120;
          puVar7[2] = puVar8;
          QThreadPool::start((QRunnable *)pQVar6,(int)puVar7);
          iVar16 = iVar16 + iVar13;
          iVar14 = iVar14 + -1;
        } while (-iVar10 != iVar14);
        QSemaphore::acquire((int)(QSemaphore *)&local_120);
        QSemaphore::~QSemaphore((QSemaphore *)&local_120);
        goto LAB_00656ae9;
      }
    }
LAB_006569c4:
    uVar9 = 0;
    do {
      iVar17 = spans[uVar9].len;
      if (iVar17 != 0) {
        pQVar1 = spans + uVar9;
        bVar2 = pQVar1->coverage;
        iVar11 = (pQVar1->y + iVar10) % (int)uVar4;
        iVar13 = pQVar1->x;
        iVar12 = (iVar14 + iVar13) % (int)uVar3;
        iVar12 = (iVar12 >> 0x1f & uVar3) + iVar12;
        do {
          iVar18 = uVar3 - iVar12;
          if (iVar17 <= (int)(uVar3 - iVar12)) {
            iVar18 = iVar17;
          }
          if (0x7ff < iVar18) {
            iVar18 = 0x800;
          }
          (*local_e8.func)((uint *)((long)pQVar1->y * *(long *)(*userData + 0x28) +
                                    *(long *)(*userData + 0x38) + (long)iVar13 * 4),
                           (uint *)(*(long *)((long)userData + 200) *
                                    (long)(int)((iVar11 >> 0x1f & uVar4) + iVar11) +
                                    *(long *)((long)userData + 0xa8) + (long)iVar12 * 4),iVar18,
                           (int)((uint)bVar2 * iVar16) >> 8);
          iVar13 = iVar13 + iVar18;
          iVar12 = iVar12 + iVar18;
          if ((int)uVar3 <= iVar12) {
            iVar12 = 0;
          }
          iVar17 = iVar17 - iVar18;
        } while (iVar17 != 0);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != (uint)count);
  }
LAB_00656ae9:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00656b0e:
  __stack_chk_fail();
}

Assistant:

static void blend_tiled_argb(int count, const QT_FT_Span *spans, void *userData)
{
    QSpanData *data = reinterpret_cast<QSpanData *>(userData);
    if (data->texture.format != QImage::Format_ARGB32_Premultiplied
        && data->texture.format != QImage::Format_RGB32) {
        blend_tiled_generic(count, spans, userData);
        return;
    }

    const Operator op = getOperator(data, spans, count);

    const int image_width = data->texture.width;
    const int image_height = data->texture.height;
    int xoff = -qRound(-data->dx) % image_width;
    int yoff = -qRound(-data->dy) % image_height;

    if (xoff < 0)
        xoff += image_width;
    if (yoff < 0)
        yoff += image_height;
    const auto func = op.func;
    const int const_alpha = data->texture.const_alpha;

    auto function = [=] (int cStart, int cEnd) {
        for (int c = cStart; c < cEnd; ++c) {
            int x = spans[c].x;
            int length = spans[c].len;
            int sx = (xoff + spans[c].x) % image_width;
            int sy = (spans[c].y + yoff) % image_height;
            if (sx < 0)
                sx += image_width;
            if (sy < 0)
                sy += image_height;

            const int coverage = (spans[c].coverage * const_alpha) >> 8;
            while (length) {
                int l = qMin(image_width - sx, length);
                if (BufferSize < l)
                    l = BufferSize;
                const uint *src = (const uint *)data->texture.scanLine(sy) + sx;
                uint *dest = ((uint *)data->rasterBuffer->scanLine(spans[c].y)) + x;
                func(dest, src, l, coverage);
                x += l;
                sx += l;
                length -= l;
                if (sx >= image_width)
                    sx = 0;
            }
        }
    };
    QT_THREAD_PARALLEL_FILLS(function);
}